

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcolor.c
# Opt level: O2

void gray_rgb_convert(j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION input_row,
                     JSAMPARRAY output_buf,int num_rows)

{
  JSAMPLE JVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JSAMPROW pJVar4;
  ulong uVar5;
  
  uVar2 = cinfo->output_width;
  while (0 < num_rows) {
    num_rows = num_rows + -1;
    pJVar3 = (*input_buf)[input_row];
    pJVar4 = *output_buf + 2;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      JVar1 = pJVar3[uVar5];
      *pJVar4 = JVar1;
      pJVar4[-1] = JVar1;
      pJVar4[-2] = JVar1;
      pJVar4 = pJVar4 + 3;
    }
    input_row = input_row + 1;
    output_buf = output_buf + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
gray_rgb_convert (j_decompress_ptr cinfo,
		  JSAMPIMAGE input_buf, JDIMENSION input_row,
		  JSAMPARRAY output_buf, int num_rows)
{
  register JSAMPROW inptr, outptr;
  register JDIMENSION col;
  JDIMENSION num_cols = cinfo->output_width;

  while (--num_rows >= 0) {
    inptr = input_buf[0][input_row++];
    outptr = *output_buf++;
    for (col = 0; col < num_cols; col++) {
      /* We can dispense with GETJSAMPLE() here */
      outptr[RGB_RED] = outptr[RGB_GREEN] = outptr[RGB_BLUE] = inptr[col];
      outptr += RGB_PIXELSIZE;
    }
  }
}